

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

bool search::isRepetition(Board *pos)

{
  vector<board::Undo,_std::allocator<board::Undo>_> *__x;
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  _Vector_base<board::Undo,_std::allocator<board::Undo>_> local_60;
  Board *local_48;
  uint64_t local_40;
  long local_38;
  
  __x = &pos->history;
  std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
            ((vector<board::Undo,_std::allocator<board::Undo>_> *)&local_60,__x);
  lVar4 = ((long)local_60._M_impl.super__Vector_impl_data._M_finish -
          (long)local_60._M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar1 = pos->fiftyMove;
  local_48 = pos;
  std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base(&local_60);
  uVar3 = lVar4 - iVar1;
  lVar4 = lVar4 * 0x18 + (long)iVar1 * -0x18 + 0x10;
  do {
    uVar6 = uVar3;
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
              ((vector<board::Undo,_std::allocator<board::Undo>_> *)&local_60,__x);
    uVar5 = ((long)local_60._M_impl.super__Vector_impl_data._M_finish -
            (long)local_60._M_impl.super__Vector_impl_data._M_start) / 0x18;
    std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base(&local_60);
    if (uVar5 <= uVar6) break;
    local_38 = lVar4 + 0x18;
    local_40 = local_48->hashKey;
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
              ((vector<board::Undo,_std::allocator<board::Undo>_> *)&local_60,__x);
    uVar2 = *(uint64_t *)
             ((long)&(local_60._M_impl.super__Vector_impl_data._M_start)->castlePerm + lVar4);
    std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base(&local_60);
    uVar3 = uVar6 + 1;
    lVar4 = local_38;
  } while (local_40 != uVar2);
  return uVar6 < uVar5;
}

Assistant:

bool search::isRepetition(board::Board& pos)
{
    for (size_t i = pos.getHistory().size() - pos.getFiftyMove(); i < pos.getHistory().size(); i++) {
        if (pos.getHashKey() == pos.getHistory()[i].getHashKey()) {
            return true;
        }
    }
    return false;
}